

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

Reg ra_scratch(ASMState *as,RegSet allow)

{
  Reg RVar1;
  long in_RDI;
  Reg r;
  ASMState *in_stack_ffffffffffffffe8;
  
  RVar1 = ra_pick(in_stack_ffffffffffffffe8,0);
  *(uint *)(in_RDI + 0xac) = 1 << ((byte)RVar1 & 0x1f) | *(uint *)(in_RDI + 0xac);
  return RVar1;
}

Assistant:

static Reg ra_scratch(ASMState *as, RegSet allow)
{
  Reg r = ra_pick(as, allow);
  ra_modified(as, r);
  RA_DBGX((as, "scratch        $r", r));
  return r;
}